

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_strifeweapons.cpp
# Opt level: O2

int AF_A_FireSigil5(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  DAngle angle;
  bool bVar2;
  PClassActor *type;
  AActor *target;
  char *__assertion;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  FSoundID local_28;
  FName local_24;
  undefined8 local_20;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00551ad7;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    target = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (target == (AActor *)0x0) {
LAB_005519b2:
        target = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)target,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00551ad7;
        }
      }
      if (numparam == 1) goto LAB_00551a32;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_00551ac7;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00551ad7;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_00551ac7;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00551a32:
        if ((target->player != (player_t *)0x0) && (target->player->ReadyWeapon != (AWeapon *)0x0))
        {
          FName::FName(&local_24,(char *)0x0);
          local_20 = 0;
          angle.Degrees._4_4_ = extraout_XMM0_Db;
          angle.Degrees._0_4_ = extraout_XMM0_Da;
          P_DamageMobj(target,target,(AActor *)0x0,0x14,&local_24,1,angle);
          local_28.ID = S_FindSound("weapons/sigilcharge");
          S_Sound(target,1,&local_28,1.0,1.0);
          type = PClass::FindActor("SpectralLightningBigBall1");
          P_SpawnPlayerMissile(target,type);
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_00551ad7;
    }
    if (target == (AActor *)0x0) goto LAB_005519b2;
  }
LAB_00551ac7:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00551ad7:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_strifeweapons.cpp"
                ,0x451,"int AF_A_FireSigil5(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FireSigil5)
{
	PARAM_ACTION_PROLOGUE;

	player_t *player = self->player;

	if (player == NULL || player->ReadyWeapon == NULL)
		return 0;

	P_DamageMobj (self, self, NULL, 5*4, 0, DMG_NO_ARMOR);
	S_Sound (self, CHAN_WEAPON, "weapons/sigilcharge", 1, ATTN_NORM);

	P_SpawnPlayerMissile (self, PClass::FindActor("SpectralLightningBigBall1"));
	return 0;
}